

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pace.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *__s1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  unsigned_long __res;
  long lVar12;
  int node_end;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint arc_end;
  allocator local_4fb;
  allocator local_4fa;
  allocator local_4f9;
  long local_4f8;
  ListGraph g;
  BitIDFunc component_begin;
  ArrayIDIDFunc to_input_id;
  string local_480;
  uint local_45c;
  string local_458;
  string input_file_name;
  int order_end;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  uint local_35c;
  ArrayIDIDFunc local_358;
  ArrayIDIDFunc local_340;
  ArrayIDIDFunc local_328;
  string local_310;
  ArrayIDIDFunc local_2f0;
  ArrayIDIDFunc local_2d8;
  ArrayIDIDFunc local_2c0;
  ArrayIDIDFunc local_2a8;
  ArrayIDIDFunc local_290;
  ArrayIDIDFunc local_278;
  ArrayIDIDFunc local_260;
  ArrayIDIDFunc local_248;
  ArrayIDIDFunc local_230;
  ArrayIDIDFunc local_218;
  ArrayIDIDFunc local_200;
  ArrayIDIDFunc local_1e8;
  ArrayIDIDFunc local_1d0;
  ArrayIDIDFunc local_1b8;
  ArrayIDIDFunc local_1a0;
  ArrayIDIDFunc local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  signal(0xf,signal_handler);
  signal(2,signal_handler);
  signal(0xb,signal_handler);
  std::__cxx11::string::string((string *)&input_file_name,"-",(allocator *)&g);
  local_45c = 0;
  for (iVar14 = 1; iVar14 < argc; iVar14 = iVar14 + 1) {
    __s1 = argv[iVar14];
    iVar11 = strcmp(__s1,"--help");
    if ((iVar11 == 0) || (((cVar1 = *__s1, cVar1 == '-' && (__s1[1] == 'h')) && (__s1[2] == '\0'))))
    {
      write(2,
            "Computes a tree depth decomposition given a graph. The graph is read by default from stdin in the PACE 2020 graph format. The output is written to stdout. Status messages can be written to stderr, if requested. By default, nothing is written to stderr. The program supports the following options:\n  -h,--help Print this message and do nothing else\n  --status  Print a message to stderr each time a\n            better tree depth decomposition is found\n  --verbose Print a message to stderr each time a tree\n            depth decomposition was computed independent\n            of whether it is better than the best one \n            found so far\n  -i <file> Instead of reading the graph from stdin,\n            read it from <file>\n  -s <seed> Use <seed> as seed for the random number\n            generator. This must be an integer. The\n            default seed is 0.\n"
            ,0x360);
      std::__cxx11::string::~string((string *)&input_file_name);
      return 1;
    }
    iVar11 = strcmp(__s1,"--verbose");
    if (iVar11 == 0) {
      print_verbose_status = true;
      print_status = true;
    }
    else {
      iVar11 = strcmp(__s1,"--status");
      if (iVar11 == 0) {
        print_status = true;
      }
      else if (cVar1 == '-') {
        if ((__s1[1] == 'i') && (__s1[2] == '\0' && iVar14 != argc + -1)) {
          std::__cxx11::string::assign((char *)&input_file_name);
          iVar14 = iVar14 + 1;
        }
        else if ((__s1[1] == 's') && (__s1[2] == '\0' && iVar14 != argc + -1)) {
          local_45c = atoi(argv[(long)iVar14 + 1]);
          iVar14 = iVar14 + 1;
        }
      }
    }
  }
  uncached_load_pace_graph(&g,&input_file_name);
  ArrayIDIDFunc::operator=(&tail,&g.tail);
  ArrayIDIDFunc::operator=(&head,&g.head);
  ListGraph::~ListGraph(&g);
  std::__cxx11::string::~string((string *)&input_file_name);
  if (print_status == true) {
    std::__cxx11::to_string(&local_480,tail.image_count_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&to_input_id
                   ,"node_count = ",&local_480);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &component_begin,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&to_input_id
                   ," arc_count = ");
    std::__cxx11::to_string(&local_458,tail.super_ArrayIDFunc<int>.preimage_count_);
    std::operator+(&input_file_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &component_begin,&local_458);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&g,
                   &input_file_name,"\n");
    std::__cxx11::string::~string((string *)&input_file_name);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&component_begin);
    std::__cxx11::string::~string((string *)&to_input_id);
    std::__cxx11::string::~string((string *)&local_480);
    write(2,(void *)g.head.super_ArrayIDFunc<int>._0_8_,(size_t)g.head.super_ArrayIDFunc<int>.data_)
    ;
    std::__cxx11::string::~string((string *)&g);
  }
  if ((print_status & 1U) != 0) {
    program_start_milli_time = get_milli_time();
  }
  iVar14 = tail.image_count_;
  local_4f8 = (ulong)(long)(int)local_45c % 0x7fffffff +
              (ulong)((ulong)(long)(int)local_45c % 0x7fffffff == 0);
  std::__cxx11::string::string((string *)&local_50,"greedy order",(allocator *)&input_file_name);
  compute_greedy_order(&g.head,&tail,&head);
  test_new_elimination_order(&local_50,&g.head);
  ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)&g);
  std::__cxx11::string::~string((string *)&local_50);
  if (iVar14 < best_tree_depth * 0x14) {
    std::__cxx11::string::string
              ((string *)&local_70,"refined bfs split in nested dissection",(allocator *)&local_3c0)
    ;
    ArrayIDIDFunc::ArrayIDIDFunc(&local_358,&tail);
    ArrayIDIDFunc::ArrayIDIDFunc(&local_328,&head);
    iVar11 = local_358.image_count_;
    local_3e0._M_dataplus._M_p = (pointer)&local_4f8;
    local_3a0._M_dataplus._M_p._0_4_ = best_tree_depth + -1;
    ArrayIDFunc<int>::ArrayIDFunc((ArrayIDFunc<int> *)&local_458,local_358.image_count_);
    local_458.field_2._M_allocated_capacity._0_4_ = iVar11;
    order_end = 0;
    identity_permutation(&to_input_id,iVar11);
    inplace_reorder_nodes_and_arc_in_preorder(&local_358,&local_328,&to_input_id);
    identity_permutation((ArrayIDIDFunc *)&local_480,iVar11);
    input_file_name._M_dataplus._M_p = (pointer)&local_3e0;
    input_file_name._M_string_length = (size_type)&local_3a0;
    input_file_name.field_2._8_8_ = &order_end;
    input_file_name.field_2._M_allocated_capacity = (size_type)&local_458;
    TinyIntIDFunc<1>::TinyIntIDFunc(&component_begin,local_358.image_count_);
    TinyIntIDFunc<1>::fill(&component_begin,1);
    for (uVar16 = 0;
        (uint)(~(local_358.super_ArrayIDFunc<int>.preimage_count_ >> 0x1f) &
              local_358.super_ArrayIDFunc<int>.preimage_count_) != uVar16; uVar16 = uVar16 + 1) {
      iVar11 = local_358.super_ArrayIDFunc<int>.data_[uVar16];
      if (local_328.super_ArrayIDFunc<int>.data_[uVar16] < iVar11) {
        component_begin.data_.data_[iVar11 / 0x40] =
             (ulong)((uint)(component_begin.data_.data_[iVar11 / 0x40] >>
                           ((long)iVar11 % 0x40 & 0x3fU)) & 1) << ((long)iVar11 % 0x40 & 0x3fU) ^
             component_begin.data_.data_[iVar11 / 0x40];
      }
    }
    g.head.super_ArrayIDFunc<int>.data_ = (int *)&local_328;
    g.head._16_8_ = &local_480;
    uVar16 = 1;
    uVar15 = 0;
    uVar13 = 0;
    g.head.super_ArrayIDFunc<int>._0_8_ = &local_358;
    g.tail.super_ArrayIDFunc<int>._0_8_ = &input_file_name;
    while( true ) {
      iVar11 = (int)uVar16;
      if (local_358.image_count_ <= iVar11) break;
      if ((component_begin.data_.data_[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0) {
        lVar12 = (long)(int)uVar13;
        arc_end = local_358.super_ArrayIDFunc<int>.preimage_count_;
        if (local_358.super_ArrayIDFunc<int>.preimage_count_ < (int)uVar13) {
          arc_end = uVar13;
        }
        for (; lVar12 < local_358.super_ArrayIDFunc<int>.preimage_count_; lVar12 = lVar12 + 1) {
          if (iVar11 <= local_358.super_ArrayIDFunc<int>.data_[lVar12]) {
            arc_end = (uint)lVar12;
            break;
          }
        }
        bVar10 = forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:396:9)>
                 ::anon_class_32_4_d72f82c3::operator()
                           ((anon_class_32_4_d72f82c3 *)&g,(int)uVar15,iVar11,uVar13,arc_end);
        uVar15 = uVar16;
        uVar13 = arc_end;
        if (!bVar10) goto LAB_0012cbfb;
      }
      uVar16 = (ulong)(iVar11 + 1);
    }
    forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:396:9)>
    ::anon_class_32_4_d72f82c3::operator()
              ((anon_class_32_4_d72f82c3 *)&g,(int)uVar15,local_358.image_count_,uVar13,
               local_358.super_ArrayIDFunc<int>.preimage_count_);
LAB_0012cbfb:
    ArrayIDFunc<unsigned_long>::~ArrayIDFunc(&component_begin.data_);
    ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)&local_480);
    if ((int)local_458._M_dataplus._M_p != 0) {
      ArrayIDIDFunc::ArrayIDIDFunc((ArrayIDIDFunc *)&input_file_name,(ArrayIDIDFunc *)&local_458);
      chain<ArrayIDIDFunc,ArrayIDIDFunc>(&g.head,(ArrayIDIDFunc *)&input_file_name,&to_input_id);
      ArrayIDIDFunc::operator=((ArrayIDIDFunc *)&local_458,&g.head);
      ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)&g);
      ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)&input_file_name);
    }
    ArrayIDFunc<int>::~ArrayIDFunc(&to_input_id.super_ArrayIDFunc<int>);
    test_new_elimination_order(&local_70,(ArrayIDIDFunc *)&local_458);
    ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)&local_458);
    ArrayIDFunc<int>::~ArrayIDFunc(&local_328.super_ArrayIDFunc<int>);
    ArrayIDFunc<int>::~ArrayIDFunc(&local_358.super_ArrayIDFunc<int>);
    std::__cxx11::string::~string((string *)&local_70);
  }
  g.head.image_count_ = 0;
  g.head._20_4_ = 0;
  g.tail.super_ArrayIDFunc<int>.preimage_count_ = 0;
  g.tail.super_ArrayIDFunc<int>._4_4_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_4f8 * 0xbc8f;
  local_4f8 = SUB168(auVar2 % ZEXT816(0x7fffffff),0);
  g.head.super_ArrayIDFunc<int>._0_8_ = (ulong)SUB164(auVar2 % ZEXT816(0x7fffffff),0) << 0x20;
  g.tail.super_ArrayIDFunc<int>.data_._0_4_ = 0;
  g.head.super_ArrayIDFunc<int>.data_ = (int *)CONCAT44(0x3e4ccccd,iVar14);
  std::__cxx11::string::string((string *)&to_input_id,"random_seed",(allocator *)&local_458);
  flow_cutter::Config::get((string *)&component_begin,(Config *)&g,(string *)&to_input_id);
  std::operator+(&local_90,
                 "edge flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed="
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &component_begin);
  ArrayIDIDFunc::ArrayIDIDFunc(&local_188,&tail);
  ArrayIDIDFunc::ArrayIDIDFunc(&local_1a0,&head);
  input_file_name._M_dataplus._M_p = (pointer)g.head.super_ArrayIDFunc<int>._0_8_;
  input_file_name._M_string_length = (size_type)g.head.super_ArrayIDFunc<int>.data_;
  input_file_name.field_2._M_allocated_capacity = g.head._16_8_;
  input_file_name.field_2._8_8_ = g.tail.super_ArrayIDFunc<int>._0_8_;
  compute_tree_depth_order<flow_cutter::FastComputeSeparator>
            ((ArrayIDIDFunc *)&local_480,&local_188,&local_1a0,
             (FastComputeSeparator *)&input_file_name,best_tree_depth + -1);
  test_new_elimination_order(&local_90,(ArrayIDIDFunc *)&local_480);
  ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)&local_480);
  ArrayIDFunc<int>::~ArrayIDFunc(&local_1a0.super_ArrayIDFunc<int>);
  ArrayIDFunc<int>::~ArrayIDFunc(&local_188.super_ArrayIDFunc<int>);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&component_begin);
  std::__cxx11::string::~string((string *)&to_input_id);
  g.head.image_count_ = 0;
  g.head._20_4_ = 0;
  g.tail.super_ArrayIDFunc<int>.preimage_count_ = 0;
  g.tail.super_ArrayIDFunc<int>._4_4_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_4f8 * 0xbc8f;
  local_4f8 = SUB168(auVar3 % ZEXT816(0x7fffffff),0);
  g.head.super_ArrayIDFunc<int>._0_8_ = (ulong)SUB164(auVar3 % ZEXT816(0x7fffffff),0) << 0x20;
  g.tail.super_ArrayIDFunc<int>.data_._0_4_ = 0;
  g.head.super_ArrayIDFunc<int>.data_ = (int *)CONCAT44(0x3e4ccccd,iVar14);
  std::__cxx11::string::string((string *)&to_input_id,"random_seed",(allocator *)&local_458);
  flow_cutter::Config::get((string *)&component_begin,(Config *)&g,(string *)&to_input_id);
  std::operator+(&local_b0,
                 "flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed="
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &component_begin);
  ArrayIDIDFunc::ArrayIDIDFunc(&local_1b8,&tail);
  ArrayIDIDFunc::ArrayIDIDFunc(&local_1d0,&head);
  input_file_name._M_dataplus._M_p = (pointer)g.head.super_ArrayIDFunc<int>._0_8_;
  input_file_name._M_string_length = (size_type)g.head.super_ArrayIDFunc<int>.data_;
  input_file_name.field_2._M_allocated_capacity = g.head._16_8_;
  input_file_name.field_2._8_8_ = g.tail.super_ArrayIDFunc<int>._0_8_;
  compute_tree_depth_order<flow_cutter::ComputeSeparator>
            ((ArrayIDIDFunc *)&local_480,&local_1b8,&local_1d0,(ComputeSeparator *)&input_file_name,
             best_tree_depth + -1);
  test_new_elimination_order(&local_b0,(ArrayIDIDFunc *)&local_480);
  ArrayIDFunc<int>::~ArrayIDFunc((ArrayIDFunc<int> *)&local_480);
  ArrayIDFunc<int>::~ArrayIDFunc(&local_1d0.super_ArrayIDFunc<int>);
  ArrayIDFunc<int>::~ArrayIDFunc(&local_1b8.super_ArrayIDFunc<int>);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&component_begin);
  std::__cxx11::string::~string((string *)&to_input_id);
  g.head.image_count_ = 0;
  g.head._20_4_ = 0;
  g.tail.super_ArrayIDFunc<int>.preimage_count_ = 0;
  g.tail.super_ArrayIDFunc<int>._4_4_ = 0;
  g.head.super_ArrayIDFunc<int>.data_ = (int *)CONCAT44(0x3e4ccccd,iVar14);
  iVar14 = 0;
  uVar13 = 0;
  do {
    local_35c = uVar13 % 100;
    local_45c = uVar13 % 0x32;
    g.tail.super_ArrayIDFunc<int>.data_._0_4_ = -(uVar13 & 1) & 3;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_4f8 * 0xbc8f;
    local_4f8 = SUB168(auVar4 % ZEXT816(0x7fffffff),0);
    g.head.super_ArrayIDFunc<int>._4_4_ = SUB164(auVar4 % ZEXT816(0x7fffffff),0);
    g.head.super_ArrayIDFunc<int>.preimage_count_ = 1;
    std::__cxx11::string::string((string *)&local_3a0,"cutter_count",&local_4f9);
    flow_cutter::Config::get(&local_3e0,(Config *)&g,&local_3a0);
    std::operator+(&local_458,"flowcutter cutter_count=",&local_3e0);
    std::operator+(&local_480,&local_458," pierce_rating=");
    std::__cxx11::string::string((string *)&local_3c0,"pierce_rating",&local_4fa);
    flow_cutter::Config::get((string *)&order_end,(Config *)&g,&local_3c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&to_input_id
                   ,&local_480,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&order_end);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &component_begin,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&to_input_id
                   ," random_seed=");
    std::__cxx11::string::string((string *)&local_380,"random_seed",&local_4fb);
    flow_cutter::Config::get(&local_310,(Config *)&g,&local_380);
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &component_begin,&local_310);
    ArrayIDIDFunc::ArrayIDIDFunc(&local_1e8,&tail);
    ArrayIDIDFunc::ArrayIDIDFunc(&local_200,&head);
    input_file_name._M_dataplus._M_p = (pointer)g.head.super_ArrayIDFunc<int>._0_8_;
    input_file_name._M_string_length = (size_type)g.head.super_ArrayIDFunc<int>.data_;
    input_file_name.field_2._M_allocated_capacity = g.head._16_8_;
    input_file_name.field_2._8_8_ = g.tail.super_ArrayIDFunc<int>._0_8_;
    compute_tree_depth_order<flow_cutter::ComputeSeparator>
              (&local_340,&local_1e8,&local_200,(ComputeSeparator *)&input_file_name,
               best_tree_depth + -1);
    test_new_elimination_order(&local_d0,&local_340);
    ArrayIDFunc<int>::~ArrayIDFunc(&local_340.super_ArrayIDFunc<int>);
    ArrayIDFunc<int>::~ArrayIDFunc(&local_200.super_ArrayIDFunc<int>);
    ArrayIDFunc<int>::~ArrayIDFunc(&local_1e8.super_ArrayIDFunc<int>);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&component_begin);
    std::__cxx11::string::~string((string *)&to_input_id);
    std::__cxx11::string::~string((string *)&order_end);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3a0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_4f8 * 0xbc8f;
    local_4f8 = SUB168(auVar5 % ZEXT816(0x7fffffff),0);
    g.head.super_ArrayIDFunc<int>._4_4_ = SUB164(auVar5 % ZEXT816(0x7fffffff),0);
    g.head.super_ArrayIDFunc<int>.preimage_count_ = 2;
    std::__cxx11::string::string((string *)&local_3a0,"cutter_count",&local_4f9);
    flow_cutter::Config::get(&local_3e0,(Config *)&g,&local_3a0);
    std::operator+(&local_458,"flowcutter cutter_count=",&local_3e0);
    std::operator+(&local_480,&local_458," pierce_rating=");
    std::__cxx11::string::string((string *)&local_3c0,"pierce_rating",&local_4fa);
    flow_cutter::Config::get((string *)&order_end,(Config *)&g,&local_3c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&to_input_id
                   ,&local_480,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&order_end);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &component_begin,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&to_input_id
                   ," random_seed=");
    std::__cxx11::string::string((string *)&local_380,"random_seed",&local_4fb);
    flow_cutter::Config::get(&local_310,(Config *)&g,&local_380);
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &component_begin,&local_310);
    ArrayIDIDFunc::ArrayIDIDFunc(&local_218,&tail);
    ArrayIDIDFunc::ArrayIDIDFunc(&local_230,&head);
    input_file_name._M_dataplus._M_p = (pointer)g.head.super_ArrayIDFunc<int>._0_8_;
    input_file_name._M_string_length = (size_type)g.head.super_ArrayIDFunc<int>.data_;
    input_file_name.field_2._M_allocated_capacity = g.head._16_8_;
    input_file_name.field_2._8_8_ = g.tail.super_ArrayIDFunc<int>._0_8_;
    compute_tree_depth_order<flow_cutter::ComputeSeparator>
              (&local_340,&local_218,&local_230,(ComputeSeparator *)&input_file_name,
               best_tree_depth + -1);
    test_new_elimination_order(&local_f0,&local_340);
    ArrayIDFunc<int>::~ArrayIDFunc(&local_340.super_ArrayIDFunc<int>);
    ArrayIDFunc<int>::~ArrayIDFunc(&local_230.super_ArrayIDFunc<int>);
    ArrayIDFunc<int>::~ArrayIDFunc(&local_218.super_ArrayIDFunc<int>);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&component_begin);
    std::__cxx11::string::~string((string *)&to_input_id);
    std::__cxx11::string::~string((string *)&order_end);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3a0);
    if ((uVar13 / 3) * 3 + iVar14 != 0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_4f8 * 0xbc8f;
      local_4f8 = SUB168(auVar6 % ZEXT816(0x7fffffff),0);
      g.head.super_ArrayIDFunc<int>._4_4_ = SUB164(auVar6 % ZEXT816(0x7fffffff),0);
      g.head.super_ArrayIDFunc<int>.preimage_count_ = 3;
      std::__cxx11::string::string((string *)&local_3a0,"cutter_count",&local_4f9);
      flow_cutter::Config::get(&local_3e0,(Config *)&g,&local_3a0);
      std::operator+(&local_458,"flowcutter cutter_count=",&local_3e0);
      std::operator+(&local_480,&local_458," pierce_rating=");
      std::__cxx11::string::string((string *)&local_3c0,"pierce_rating",&local_4fa);
      flow_cutter::Config::get((string *)&order_end,(Config *)&g,&local_3c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &to_input_id,&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&order_end
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &component_begin,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &to_input_id," random_seed=");
      std::__cxx11::string::string((string *)&local_380,"random_seed",&local_4fb);
      flow_cutter::Config::get(&local_310,(Config *)&g,&local_380);
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &component_begin,&local_310);
      ArrayIDIDFunc::ArrayIDIDFunc(&local_248,&tail);
      ArrayIDIDFunc::ArrayIDIDFunc(&local_260,&head);
      input_file_name._M_dataplus._M_p = (pointer)g.head.super_ArrayIDFunc<int>._0_8_;
      input_file_name._M_string_length = (size_type)g.head.super_ArrayIDFunc<int>.data_;
      input_file_name.field_2._M_allocated_capacity = g.head._16_8_;
      input_file_name.field_2._8_8_ = g.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_340,&local_248,&local_260,(ComputeSeparator *)&input_file_name,
                 best_tree_depth + -1);
      test_new_elimination_order(&local_110,&local_340);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_340.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_260.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_248.super_ArrayIDFunc<int>);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&component_begin);
      std::__cxx11::string::~string((string *)&to_input_id);
      std::__cxx11::string::~string((string *)&order_end);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3a0);
    }
    if (0xf < uVar13 % 0x14) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_4f8 * 0xbc8f;
      local_4f8 = SUB168(auVar7 % ZEXT816(0x7fffffff),0);
      g.head.super_ArrayIDFunc<int>._4_4_ = SUB164(auVar7 % ZEXT816(0x7fffffff),0);
      g.head.super_ArrayIDFunc<int>.preimage_count_ = 0x14;
      std::__cxx11::string::string((string *)&local_3a0,"cutter_count",&local_4f9);
      flow_cutter::Config::get(&local_3e0,(Config *)&g,&local_3a0);
      std::operator+(&local_458,"flowcutter cutter_count=",&local_3e0);
      std::operator+(&local_480,&local_458," pierce_rating=");
      std::__cxx11::string::string((string *)&local_3c0,"pierce_rating",&local_4fa);
      flow_cutter::Config::get((string *)&order_end,(Config *)&g,&local_3c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &to_input_id,&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&order_end
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &component_begin,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &to_input_id," random_seed=");
      std::__cxx11::string::string((string *)&local_380,"random_seed",&local_4fb);
      flow_cutter::Config::get(&local_310,(Config *)&g,&local_380);
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &component_begin,&local_310);
      ArrayIDIDFunc::ArrayIDIDFunc(&local_278,&tail);
      ArrayIDIDFunc::ArrayIDIDFunc(&local_290,&head);
      input_file_name._M_dataplus._M_p = (pointer)g.head.super_ArrayIDFunc<int>._0_8_;
      input_file_name._M_string_length = (size_type)g.head.super_ArrayIDFunc<int>.data_;
      input_file_name.field_2._M_allocated_capacity = g.head._16_8_;
      input_file_name.field_2._8_8_ = g.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_340,&local_278,&local_290,(ComputeSeparator *)&input_file_name,
                 best_tree_depth + -1);
      test_new_elimination_order(&local_130,&local_340);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_340.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_290.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_278.super_ArrayIDFunc<int>);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&component_begin);
      std::__cxx11::string::~string((string *)&to_input_id);
      std::__cxx11::string::~string((string *)&order_end);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3a0);
    }
    if (0x1e < local_45c) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_4f8 * 0xbc8f;
      local_4f8 = SUB168(auVar8 % ZEXT816(0x7fffffff),0);
      g.head.super_ArrayIDFunc<int>._4_4_ = SUB164(auVar8 % ZEXT816(0x7fffffff),0);
      g.head.super_ArrayIDFunc<int>.preimage_count_ = 0x28;
      std::__cxx11::string::string((string *)&local_3a0,"cutter_count",&local_4f9);
      flow_cutter::Config::get(&local_3e0,(Config *)&g,&local_3a0);
      std::operator+(&local_458,"flowcutter cutter_count=",&local_3e0);
      std::operator+(&local_480,&local_458," pierce_rating=");
      std::__cxx11::string::string((string *)&local_3c0,"pierce_rating",&local_4fa);
      flow_cutter::Config::get((string *)&order_end,(Config *)&g,&local_3c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &to_input_id,&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&order_end
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &component_begin,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &to_input_id," random_seed=");
      std::__cxx11::string::string((string *)&local_380,"random_seed",&local_4fb);
      flow_cutter::Config::get(&local_310,(Config *)&g,&local_380);
      std::operator+(&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &component_begin,&local_310);
      ArrayIDIDFunc::ArrayIDIDFunc(&local_2a8,&tail);
      ArrayIDIDFunc::ArrayIDIDFunc(&local_2c0,&head);
      input_file_name._M_dataplus._M_p = (pointer)g.head.super_ArrayIDFunc<int>._0_8_;
      input_file_name._M_string_length = (size_type)g.head.super_ArrayIDFunc<int>.data_;
      input_file_name.field_2._M_allocated_capacity = g.head._16_8_;
      input_file_name.field_2._8_8_ = g.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_340,&local_2a8,&local_2c0,(ComputeSeparator *)&input_file_name,
                 best_tree_depth + -1);
      test_new_elimination_order(&local_150,&local_340);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_340.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_2c0.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_2a8.super_ArrayIDFunc<int>);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&component_begin);
      std::__cxx11::string::~string((string *)&to_input_id);
      std::__cxx11::string::~string((string *)&order_end);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3a0);
    }
    if (0x62 < local_35c) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_4f8 * 0xbc8f;
      local_4f8 = SUB168(auVar9 % ZEXT816(0x7fffffff),0);
      g.head.super_ArrayIDFunc<int>._4_4_ = SUB164(auVar9 % ZEXT816(0x7fffffff),0);
      g.head.super_ArrayIDFunc<int>.preimage_count_ = 0x50;
      std::__cxx11::string::string((string *)&local_3a0,"cutter_count",&local_4f9);
      flow_cutter::Config::get(&local_3e0,(Config *)&g,&local_3a0);
      std::operator+(&local_458,"flowcutter cutter_count=",&local_3e0);
      std::operator+(&local_480,&local_458," pierce_rating=");
      std::__cxx11::string::string((string *)&local_3c0,"pierce_rating",&local_4fa);
      flow_cutter::Config::get((string *)&order_end,(Config *)&g,&local_3c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &to_input_id,&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&order_end
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &component_begin,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &to_input_id," random_seed=");
      std::__cxx11::string::string((string *)&local_380,"random_seed",&local_4fb);
      flow_cutter::Config::get(&local_310,(Config *)&g,&local_380);
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &component_begin,&local_310);
      ArrayIDIDFunc::ArrayIDIDFunc(&local_2d8,&tail);
      ArrayIDIDFunc::ArrayIDIDFunc(&local_2f0,&head);
      input_file_name._M_dataplus._M_p = (pointer)g.head.super_ArrayIDFunc<int>._0_8_;
      input_file_name._M_string_length = (size_type)g.head.super_ArrayIDFunc<int>.data_;
      input_file_name.field_2._M_allocated_capacity = g.head._16_8_;
      input_file_name.field_2._8_8_ = g.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_340,&local_2d8,&local_2f0,(ComputeSeparator *)&input_file_name,
                 best_tree_depth + -1);
      test_new_elimination_order(&local_170,&local_340);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_340.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_2f0.super_ArrayIDFunc<int>);
      ArrayIDFunc<int>::~ArrayIDFunc(&local_2d8.super_ArrayIDFunc<int>);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&component_begin);
      std::__cxx11::string::~string((string *)&to_input_id);
      std::__cxx11::string::~string((string *)&order_end);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3a0);
    }
    uVar13 = uVar13 + 1;
    iVar14 = iVar14 + -1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    signal(SIGTERM, signal_handler);
    signal(SIGINT, signal_handler);
    signal(SIGSEGV, signal_handler);

    int random_seed = 0;

    try {
        {
            string input_file_name = "-";
            for (int i = 1; i < argc; ++i) {
                if (!strcmp(argv[i], "--help") || !strcmp(argv[i], "-h")){
                    char msg[] = "Computes a tree depth decomposition given a graph. The graph is read by default from stdin in the PACE 2020 graph format. The output is written to stdout. Status messages can be written to stderr, if requested. By default, nothing is written to stderr. The program supports the following options:\n"
                    "  -h,--help Print this message and do nothing else\n"
                    "  --status  Print a message to stderr each time a\n"
                    "            better tree depth decomposition is found\n"
                    "  --verbose Print a message to stderr each time a tree\n"
                    "            depth decomposition was computed independent\n"
                    "            of whether it is better than the best one \n"
                    "            found so far\n"
                    "  -i <file> Instead of reading the graph from stdin,\n"
                    "            read it from <file>\n"
                    "  -s <seed> Use <seed> as seed for the random number\n"
                    "            generator. This must be an integer. The\n"
                    "            default seed is 0.\n";
                    ignore_return_value(write(STDERR_FILENO, msg, sizeof(msg)-1));
                    return 1;
                } else if (!strcmp(argv[i], "--verbose")) {
                    print_verbose_status = true;
                    print_status = true;
                } else if (!strcmp(argv[i], "--status")) {
                    print_status = true;
                } else if (!strcmp(argv[i], "-i") && i != argc - 1) {
                    ++i;
                    input_file_name = argv[i];
                } else if (!strcmp(argv[i], "-s") && i != argc - 1) {
                    ++i;
                    random_seed = atoi(argv[i]);
                }
            }

            auto g = uncached_load_pace_graph(input_file_name);
            tail = std::move(g.tail);
            head = std::move(g.head);
        }

        if (print_status) {
            string msg = "node_count = " + to_string(tail.image_count()) + " arc_count = " + to_string(tail.preimage_count()) + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }

        if (print_status)
            program_start_milli_time = get_milli_time();

        const int node_count = tail.image_count();
                        
        #ifdef PARALLELIZE
        #pragma omp parallel
        #endif
        {
            try {
                std::minstd_rand rand_gen;
                rand_gen.seed(random_seed
                    #ifdef PARALLELIZE
                    + omp_get_thread_num()
                    #endif
                );

                #ifdef PARALLELIZE
                #pragma omp sections nowait
                #endif
                {
                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    {
                        test_new_elimination_order("greedy order", compute_greedy_order(tail, head));

                        if(20*best_tree_depth > node_count)
                            test_new_elimination_order("refined bfs split in nested dissection", compute_tree_depth_order(
                                tail, head, 
                                [&](const ArrayIDIDFunc& tail, const ArrayIDIDFunc& head, int max_size) {
                                    return compute_separator_by_running_bfs(tail, head, max_size, rand_gen);
                                },
                                best_tree_depth - 1)
                            );
                    }

                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    {
                        flow_cutter::Config config;
                        config.random_seed = rand_gen();
                        config.cutter_count = 0;
                        config.pierce_rating = flow_cutter::Config::PierceRating::max_target_minus_source_hop_dist;
                        config.max_cut_size = node_count;
                        test_new_elimination_order(
                            "edge flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::FastComputeSeparator(config),
                                best_tree_depth - 1));
                    }
                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    { 
                        flow_cutter::Config config;
                        config.random_seed = rand_gen();
                        config.cutter_count = 0;
                        config.pierce_rating = flow_cutter::Config::PierceRating::max_target_minus_source_hop_dist;
                        config.max_cut_size = node_count;
                        test_new_elimination_order(
                            "flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1)
                        );
                    }
                }

                {
                    flow_cutter::Config config;
                    config.max_cut_size = node_count;

                    for (int i = 0;; ++i) {
                        
                        if (i % 2 == 0) {
                            config.pierce_rating = flow_cutter::Config::PierceRating::
                                max_target_minus_source_hop_dist;
                        } else {
                            config.pierce_rating = flow_cutter::Config::PierceRating::random;
                        }
                        
                        config.cutter_count = 1;
                        config.random_seed = rand_gen();
                        test_new_elimination_order(
                            "flowcutter"
                            " cutter_count="
                                + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1));


                        config.cutter_count = 2;
                        config.random_seed = rand_gen();
                        test_new_elimination_order(
                            "flowcutter"
                            " cutter_count="
                                + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1));

                        if((i%3)>0){
                                config.cutter_count = 3;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%20)>15){
                                config.cutter_count = 20;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%50)>30){
                                config.cutter_count = 40;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%100)>98){
                                config.cutter_count = 80;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }
                    }
                }
            }
            catch (...)
            {
                signal_handler(0);
            }
        }
    }
    catch (...)
    {
        signal_handler(0);
    }
}